

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O3

int ssl_write_client_key_exchange(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_ciphersuite_t *pmVar1;
  mbedtls_ssl_config *pmVar2;
  mbedtls_ssl_handshake_params *pmVar3;
  int iVar4;
  size_t sVar5;
  int line;
  char *pcVar6;
  size_t sVar7;
  size_t n;
  size_t local_30;
  
  pmVar1 = ssl->transform_negotiate->ciphersuite_info;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,0x9fd,"=> write client key exchange");
  switch(pmVar1->key_exchange) {
  case MBEDTLS_KEY_EXCHANGE_RSA:
    sVar7 = 4;
    iVar4 = ssl_write_encrypted_pms(ssl,4,&local_30,0);
    if (iVar4 != 0) {
      return iVar4;
    }
    break;
  case MBEDTLS_KEY_EXCHANGE_DHE_RSA:
    local_30 = (ssl->handshake->dhm_ctx).len;
    ssl->out_msg[4] = (uchar)(local_30 >> 8);
    ssl->out_msg[5] = (uchar)local_30;
    pmVar3 = ssl->handshake;
    sVar7 = mbedtls_mpi_size(&(pmVar3->dhm_ctx).P);
    iVar4 = mbedtls_dhm_make_public
                      (&pmVar3->dhm_ctx,(int)sVar7,ssl->out_msg + 6,local_30,ssl->conf->f_rng,
                       ssl->conf->p_rng);
    if (iVar4 != 0) {
      pcVar6 = "mbedtls_dhm_make_public";
      line = 0xa11;
      goto LAB_001697f1;
    }
    mbedtls_debug_print_mpi
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0xa15,"DHM: X ",&(ssl->handshake->dhm_ctx).X);
    mbedtls_debug_print_mpi
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0xa16,"DHM: GX",&(ssl->handshake->dhm_ctx).GX);
    pmVar3 = ssl->handshake;
    iVar4 = mbedtls_dhm_calc_secret
                      (&pmVar3->dhm_ctx,pmVar3->premaster,0x424,&pmVar3->pmslen,ssl->conf->f_rng,
                       ssl->conf->p_rng);
    if (iVar4 != 0) {
      pcVar6 = "mbedtls_dhm_calc_secret";
      line = 0xa1e;
      goto LAB_001697f1;
    }
    mbedtls_debug_print_mpi
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0xa22,"DHM: K ",&(ssl->handshake->dhm_ctx).K);
    sVar7 = 6;
    break;
  case MBEDTLS_KEY_EXCHANGE_ECDHE_RSA:
  case MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA:
  case MBEDTLS_KEY_EXCHANGE_ECDH_RSA:
  case MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA:
    iVar4 = mbedtls_ecdh_make_public
                      (&ssl->handshake->ecdh_ctx,&local_30,ssl->out_msg + 4,1000,ssl->conf->f_rng,
                       ssl->conf->p_rng);
    if (iVar4 != 0) {
      pcVar6 = "mbedtls_ecdh_make_public";
      line = 0xa3a;
      goto LAB_001697f1;
    }
    mbedtls_debug_print_ecp
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0xa3e,"ECDH: Q",&(ssl->handshake->ecdh_ctx).Q);
    pmVar3 = ssl->handshake;
    iVar4 = mbedtls_ecdh_calc_secret
                      (&pmVar3->ecdh_ctx,&pmVar3->pmslen,pmVar3->premaster,0x400,ssl->conf->f_rng,
                       ssl->conf->p_rng);
    if (iVar4 != 0) {
      pcVar6 = "mbedtls_ecdh_calc_secret";
      line = 0xa46;
      goto LAB_001697f1;
    }
    mbedtls_debug_print_mpi
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0xa4a,"ECDH: z",&(ssl->handshake->ecdh_ctx).z);
    sVar7 = 4;
    break;
  case MBEDTLS_KEY_EXCHANGE_PSK:
  case MBEDTLS_KEY_EXCHANGE_DHE_PSK:
  case MBEDTLS_KEY_EXCHANGE_RSA_PSK:
  case MBEDTLS_KEY_EXCHANGE_ECDHE_PSK:
    pmVar2 = ssl->conf;
    if ((pmVar2->psk == (uchar *)0x0) || (pmVar2->psk_identity == (uchar *)0x0)) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0xa5c,"got no private key for PSK");
      return -0x7600;
    }
    local_30 = pmVar2->psk_identity_len;
    if (local_30 - 0x3ffb < 0xffffffffffffbfff) {
      pcVar6 = "psk identity too long or SSL buffer too short";
      iVar4 = 0xa66;
LAB_001692b6:
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,iVar4,pcVar6);
      return -0x6a00;
    }
    ssl->out_msg[4] = (uchar)(local_30 >> 8);
    ssl->out_msg[5] = (uchar)local_30;
    memcpy(ssl->out_msg + 6,ssl->conf->psk_identity,ssl->conf->psk_identity_len);
    if (3 < pmVar1->key_exchange - MBEDTLS_KEY_EXCHANGE_PSK) {
      iVar4 = 0xab1;
      goto LAB_0016943e;
    }
    pmVar2 = ssl->conf;
    sVar5 = pmVar2->psk_identity_len;
    sVar7 = sVar5 + 6;
    switch(pmVar1->key_exchange) {
    case MBEDTLS_KEY_EXCHANGE_PSK:
      local_30 = 0;
      break;
    case MBEDTLS_KEY_EXCHANGE_DHE_PSK:
      local_30 = (ssl->handshake->dhm_ctx).len;
      if (0x4000 < local_30 + sVar5 + 8) {
        pcVar6 = "psk identity or DHM size too long or SSL buffer too short";
        iVar4 = 0xa8a;
        goto LAB_001692b6;
      }
      sVar7 = sVar5 + 8;
      ssl->out_msg[sVar5 + 6] = (uchar)(local_30 >> 8);
      ssl->out_msg[sVar5 + 7] = (uchar)local_30;
      pmVar3 = ssl->handshake;
      sVar5 = mbedtls_mpi_size(&(pmVar3->dhm_ctx).P);
      iVar4 = mbedtls_dhm_make_public
                        (&pmVar3->dhm_ctx,(int)sVar5,ssl->out_msg + sVar7,local_30,ssl->conf->f_rng,
                         ssl->conf->p_rng);
      if (iVar4 != 0) {
        pcVar6 = "mbedtls_dhm_make_public";
        line = 0xa97;
        goto LAB_001697f1;
      }
      break;
    case MBEDTLS_KEY_EXCHANGE_RSA_PSK:
      iVar4 = ssl_write_encrypted_pms(ssl,sVar7,&local_30,2);
      if (iVar4 != 0) {
        return iVar4;
      }
      break;
    case MBEDTLS_KEY_EXCHANGE_ECDHE_PSK:
      iVar4 = mbedtls_ecdh_make_public
                        (&ssl->handshake->ecdh_ctx,&local_30,ssl->out_msg + sVar7,0x3ffa - sVar5,
                         pmVar2->f_rng,pmVar2->p_rng);
      if (iVar4 != 0) {
        pcVar6 = "mbedtls_ecdh_make_public";
        line = 0xaa8;
        goto LAB_001697f1;
      }
      mbedtls_debug_print_ecp
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0xaac,"ECDH: Q",&(ssl->handshake->ecdh_ctx).Q);
    }
    iVar4 = mbedtls_ssl_psk_derive_premaster(ssl,pmVar1->key_exchange);
    if (iVar4 != 0) {
      pcVar6 = "mbedtls_ssl_psk_derive_premaster";
      line = 0xab8;
      goto LAB_001697f1;
    }
    break;
  default:
    iVar4 = 0xac9;
LAB_0016943e:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,iVar4,"should never happen");
    return -0x6c00;
  }
  ssl->out_msglen = sVar7 + local_30;
  ssl->out_msgtype = 0x16;
  *ssl->out_msg = '\x10';
  ssl->state = ssl->state + 1;
  iVar4 = mbedtls_ssl_write_record(ssl);
  if (iVar4 == 0) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0xad9,"<= write client key exchange");
    return 0;
  }
  pcVar6 = "mbedtls_ssl_write_record";
  line = 0xad5;
LAB_001697f1:
  mbedtls_debug_print_ret
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,line,pcVar6,iVar4);
  return iVar4;
}

Assistant:

static int ssl_write_client_key_exchange( mbedtls_ssl_context *ssl )
{
    int ret;
    size_t i, n;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write client key exchange" ) );

#if defined(MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_RSA )
    {
        /*
         * DHM key exchange -- send G^X mod P
         */
        n = ssl->handshake->dhm_ctx.len;

        ssl->out_msg[4] = (unsigned char)( n >> 8 );
        ssl->out_msg[5] = (unsigned char)( n      );
        i = 6;

        ret = mbedtls_dhm_make_public( &ssl->handshake->dhm_ctx,
                                (int) mbedtls_mpi_size( &ssl->handshake->dhm_ctx.P ),
                               &ssl->out_msg[i], n,
                                ssl->conf->f_rng, ssl->conf->p_rng );
        if( ret != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_dhm_make_public", ret );
            return( ret );
        }

        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: X ", &ssl->handshake->dhm_ctx.X  );
        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: GX", &ssl->handshake->dhm_ctx.GX );

        if( ( ret = mbedtls_dhm_calc_secret( &ssl->handshake->dhm_ctx,
                                      ssl->handshake->premaster,
                                      MBEDTLS_PREMASTER_SIZE,
                                     &ssl->handshake->pmslen,
                                      ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_dhm_calc_secret", ret );
            return( ret );
        }

        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: K ", &ssl->handshake->dhm_ctx.K  );
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED) ||                     \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED) ||                   \
    defined(MBEDTLS_KEY_EXCHANGE_ECDH_RSA_ENABLED) ||                      \
    defined(MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDH_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA )
    {
        /*
         * ECDH key exchange -- send client public value
         */
        i = 4;

        ret = mbedtls_ecdh_make_public( &ssl->handshake->ecdh_ctx,
                                &n,
                                &ssl->out_msg[i], 1000,
                                ssl->conf->f_rng, ssl->conf->p_rng );
        if( ret != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecdh_make_public", ret );
            return( ret );
        }

        MBEDTLS_SSL_DEBUG_ECP( 3, "ECDH: Q", &ssl->handshake->ecdh_ctx.Q );

        if( ( ret = mbedtls_ecdh_calc_secret( &ssl->handshake->ecdh_ctx,
                                      &ssl->handshake->pmslen,
                                       ssl->handshake->premaster,
                                       MBEDTLS_MPI_MAX_SIZE,
                                       ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecdh_calc_secret", ret );
            return( ret );
        }

        MBEDTLS_SSL_DEBUG_MPI( 3, "ECDH: z", &ssl->handshake->ecdh_ctx.z );
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDH_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE__SOME__PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK )
    {
        /*
         * opaque psk_identity<0..2^16-1>;
         */
        if( ssl->conf->psk == NULL || ssl->conf->psk_identity == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "got no private key for PSK" ) );
            return( MBEDTLS_ERR_SSL_PRIVATE_KEY_REQUIRED );
        }

        i = 4;
        n = ssl->conf->psk_identity_len;

        if( i + 2 + n > MBEDTLS_SSL_MAX_CONTENT_LEN )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "psk identity too long or "
                                        "SSL buffer too short" ) );
            return( MBEDTLS_ERR_SSL_BUFFER_TOO_SMALL );
        }

        ssl->out_msg[i++] = (unsigned char)( n >> 8 );
        ssl->out_msg[i++] = (unsigned char)( n      );

        memcpy( ssl->out_msg + i, ssl->conf->psk_identity, ssl->conf->psk_identity_len );
        i += ssl->conf->psk_identity_len;

#if defined(MBEDTLS_KEY_EXCHANGE_PSK_ENABLED)
        if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK )
        {
            n = 0;
        }
        else
#endif
#if defined(MBEDTLS_KEY_EXCHANGE_RSA_PSK_ENABLED)
        if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK )
        {
            if( ( ret = ssl_write_encrypted_pms( ssl, i, &n, 2 ) ) != 0 )
                return( ret );
        }
        else
#endif
#if defined(MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED)
        if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK )
        {
            /*
             * ClientDiffieHellmanPublic public (DHM send G^X mod P)
             */
            n = ssl->handshake->dhm_ctx.len;

            if( i + 2 + n > MBEDTLS_SSL_MAX_CONTENT_LEN )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "psk identity or DHM size too long"
                                            " or SSL buffer too short" ) );
                return( MBEDTLS_ERR_SSL_BUFFER_TOO_SMALL );
            }

            ssl->out_msg[i++] = (unsigned char)( n >> 8 );
            ssl->out_msg[i++] = (unsigned char)( n      );

            ret = mbedtls_dhm_make_public( &ssl->handshake->dhm_ctx,
                    (int) mbedtls_mpi_size( &ssl->handshake->dhm_ctx.P ),
                    &ssl->out_msg[i], n,
                    ssl->conf->f_rng, ssl->conf->p_rng );
            if( ret != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_dhm_make_public", ret );
                return( ret );
            }
        }
        else
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED)
        if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK )
        {
            /*
             * ClientECDiffieHellmanPublic public;
             */
            ret = mbedtls_ecdh_make_public( &ssl->handshake->ecdh_ctx, &n,
                    &ssl->out_msg[i], MBEDTLS_SSL_MAX_CONTENT_LEN - i,
                    ssl->conf->f_rng, ssl->conf->p_rng );
            if( ret != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecdh_make_public", ret );
                return( ret );
            }

            MBEDTLS_SSL_DEBUG_ECP( 3, "ECDH: Q", &ssl->handshake->ecdh_ctx.Q );
        }
        else
#endif /* MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED */
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        if( ( ret = mbedtls_ssl_psk_derive_premaster( ssl,
                        ciphersuite_info->key_exchange ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_psk_derive_premaster", ret );
            return( ret );
        }
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE__SOME__PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_RSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA )
    {
        i = 4;
        if( ( ret = ssl_write_encrypted_pms( ssl, i, &n, 0 ) ) != 0 )
            return( ret );
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_RSA_ENABLED */
    {
        ((void) ciphersuite_info);
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    ssl->out_msglen  = i + n;
    ssl->out_msgtype = MBEDTLS_SSL_MSG_HANDSHAKE;
    ssl->out_msg[0]  = MBEDTLS_SSL_HS_CLIENT_KEY_EXCHANGE;

    ssl->state++;

    if( ( ret = mbedtls_ssl_write_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_write_record", ret );
        return( ret );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write client key exchange" ) );

    return( 0 );
}